

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTcT3ExcTable::add_catch
          (CTcT3ExcTable *this,ulong protected_start_ofs,ulong protected_end_ofs,ulong exc_obj_id,
          ulong catch_block_ofs)

{
  void *pvVar1;
  long in_RCX;
  long *plVar2;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_R8;
  CTcT3ExcEntry *entry;
  
  if (in_RDI[2] == in_RDI[3]) {
    in_RDI[3] = in_RDI[3] + 0x400;
    pvVar1 = realloc((void *)in_RDI[1],in_RDI[3] << 5);
    in_RDI[1] = (long)pvVar1;
  }
  plVar2 = (long *)(in_RDI[1] + in_RDI[2] * 0x20);
  *plVar2 = in_RSI - *in_RDI;
  plVar2[1] = in_RDX - *in_RDI;
  plVar2[2] = in_RCX;
  plVar2[3] = in_R8 - *in_RDI;
  in_RDI[2] = in_RDI[2] + 1;
  return;
}

Assistant:

void CTcT3ExcTable::add_catch(ulong protected_start_ofs,
                              ulong protected_end_ofs,
                              ulong exc_obj_id, ulong catch_block_ofs)
{
    CTcT3ExcEntry *entry;

    /* if necessary, expand our table */
    if (exc_used_ == exc_alloced_)
    {
        /* expand the table a bit */
        exc_alloced_ += 1024;

        /* reallocate the table at the larger size */
        table_ = (CTcT3ExcEntry *)
                 t3realloc(table_, exc_alloced_ * sizeof(table_[0]));
    }

    /* 
     *   set up the new entry - store the offsets relative to the method
     *   header start address 
     */
    entry = table_ + exc_used_;
    entry->start_ofs = protected_start_ofs - method_ofs_;
    entry->end_ofs = protected_end_ofs - method_ofs_;
    entry->exc_obj_id = exc_obj_id;
    entry->catch_ofs = catch_block_ofs - method_ofs_;

    /* consume the new entry */
    ++exc_used_;
}